

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v6::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  ulong in_RAX;
  char *p;
  char *p_00;
  size_t sVar2;
  ulong uVar3;
  char *unaff_RBX;
  char *pcVar4;
  char buf [7];
  
  uVar3 = s.size_;
  pcVar4 = s.data_;
  p_00 = &stack0xffffffffffffffc8;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_00201c60;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  p = pcVar4;
  if (3 < uVar3) {
    for (; p < pcVar4 + (uVar3 - 3);
        p = utf8_to_utf16::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,p)) {
    }
  }
  pcVar4 = pcVar4 + (uVar3 - (long)p);
  if (pcVar4 != (char *)0x0) {
    if ((long)pcVar4 < 0) {
      assert_fail(unaff_RBX,0,(char *)(in_RAX & 0xff00000000000000));
    }
    memcpy(&stack0xffffffffffffffc8,p,(size_t)pcVar4);
    do {
      p_00 = utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)this,p_00);
    } while ((long)p_00 - (long)&stack0xffffffffffffffc8 < (long)pcVar4);
  }
  sVar2 = (this->buffer_).super_buffer<wchar_t>.size_;
  uVar3 = sVar2 + 1;
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ < uVar3) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
    sVar2 = (this->buffer_).super_buffer<wchar_t>.size_;
    uVar3 = sVar2 + 1;
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  (this->buffer_).super_buffer<wchar_t>.size_ = uVar3;
  pwVar1[sVar2] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}